

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall capnp::BuilderCapabilityTable::dropCap(BuilderCapabilityTable *this,uint index)

{
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  ulong uVar4;
  
  uVar4 = (ulong)index;
  pMVar1 = (this->table).builder.ptr;
  if ((ulong)((long)(this->table).builder.pos - (long)pMVar1 >> 4) <= uVar4) {
    dropCap();
    return;
  }
  pDVar2 = pMVar1[uVar4].ptr.disposer;
  pCVar3 = pMVar1[uVar4].ptr.ptr;
  pMVar1[uVar4].ptr.disposer = (Disposer *)0x0;
  pMVar1[uVar4].ptr.ptr = (ClientHook *)0x0;
  if (pCVar3 != (ClientHook *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar3->_vptr_ClientHook[-2] + (long)&pCVar3->_vptr_ClientHook);
    return;
  }
  return;
}

Assistant:

void BuilderCapabilityTable::dropCap(uint index) {
  KJ_ASSERT(index < table.size(), "Invalid capability descriptor in message.") {
    return;
  }
  table[index] = nullptr;
}